

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O2

void __thiscall
Assimp::StreamReader<true,_true>::IncPtr(StreamReader<true,_true> *this,intptr_t plus)

{
  int8_t *piVar1;
  DeadlyImportError *this_00;
  allocator<char> local_39;
  string local_38;
  
  piVar1 = this->current;
  this->current = piVar1 + plus;
  if (piVar1 + plus <= this->limit) {
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"End of file or read limit was reached",&local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void IncPtr(intptr_t plus)    {
        current += plus;
        if (current > limit) {
            throw DeadlyImportError("End of file or read limit was reached");
        }
    }